

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen_cs_example.cc
# Opt level: O0

void GEN_CS::gen_cs_example_ips(cb_to_cs *c,label *ld,label *cs_ld)

{
  size_t sVar1;
  cb_class *pcVar2;
  cb_class **ppcVar3;
  v_array<CB::cb_class> *in_RSI;
  long in_RDI;
  wclass wc_1;
  cb_class *cl;
  cb_class *__end2;
  cb_class *__begin2;
  v_array<CB::cb_class> *__range2;
  wclass wc;
  uint32_t i;
  undefined4 in_stack_ffffffffffffff88;
  float in_stack_ffffffffffffff8c;
  float in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  float local_64;
  cb_class *local_40;
  uint local_1c;
  
  v_array<COST_SENSITIVE::wclass>::clear
            ((v_array<COST_SENSITIVE::wclass> *)
             CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
  sVar1 = v_array<CB::cb_class>::size(in_RSI);
  if (sVar1 == 0) {
LAB_003d8707:
    for (local_1c = 1; local_1c <= *(uint *)(in_RDI + 8); local_1c = local_1c + 1) {
      if ((*(long *)(in_RDI + 0x50) != 0) && (local_1c == *(uint *)(*(long *)(in_RDI + 0x50) + 4)))
      {
        in_stack_ffffffffffffff94 = **(undefined4 **)(in_RDI + 0x50);
        safe_probability(5.650583e-39);
        *(long *)(in_RDI + 0x40) = *(long *)(in_RDI + 0x40) + 1;
        local_64 = (float)*(ulong *)(in_RDI + 0x40);
        *(float *)(in_RDI + 0x38) =
             (1.0 / local_64) *
             (**(float **)(in_RDI + 0x50) * **(float **)(in_RDI + 0x50) + -*(float *)(in_RDI + 0x38)
             ) + *(float *)(in_RDI + 0x38);
        *(undefined4 *)(in_RDI + 0x48) = 0;
        *(undefined4 *)(in_RDI + 0x4c) = **(undefined4 **)(in_RDI + 0x50);
      }
      v_array<COST_SENSITIVE::wclass>::push_back
                ((v_array<COST_SENSITIVE::wclass> *)
                 CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                 (wclass *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    }
  }
  else {
    sVar1 = v_array<CB::cb_class>::size(in_RSI);
    if (sVar1 == 1) {
      pcVar2 = v_array<CB::cb_class>::operator[](in_RSI,0);
      if ((pcVar2->cost != 3.4028235e+38) || (NAN(pcVar2->cost))) goto LAB_003d8707;
    }
    ppcVar3 = v_array<CB::cb_class>::begin(in_RSI);
    local_40 = *ppcVar3;
    ppcVar3 = v_array<CB::cb_class>::end(in_RSI);
    pcVar2 = *ppcVar3;
    for (; local_40 != pcVar2; local_40 = local_40 + 1) {
      if ((*(long *)(in_RDI + 0x50) != 0) &&
         (local_40->action == *(uint32_t *)(*(long *)(in_RDI + 0x50) + 4))) {
        in_stack_ffffffffffffff88 = **(undefined4 **)(in_RDI + 0x50);
        safe_probability(5.651217e-39);
        *(long *)(in_RDI + 0x40) = *(long *)(in_RDI + 0x40) + 1;
        in_stack_ffffffffffffff8c = (float)(long)*(ulong *)(in_RDI + 0x40);
        in_stack_ffffffffffffff90 = (float)*(ulong *)(in_RDI + 0x40);
        *(float *)(in_RDI + 0x38) =
             (1.0 / in_stack_ffffffffffffff90) *
             (**(float **)(in_RDI + 0x50) * **(float **)(in_RDI + 0x50) + -*(float *)(in_RDI + 0x38)
             ) + *(float *)(in_RDI + 0x38);
        *(undefined4 *)(in_RDI + 0x48) = 0;
        *(undefined4 *)(in_RDI + 0x4c) = **(undefined4 **)(in_RDI + 0x50);
      }
      v_array<COST_SENSITIVE::wclass>::push_back
                ((v_array<COST_SENSITIVE::wclass> *)
                 CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                 (wclass *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    }
  }
  return;
}

Assistant:

void gen_cs_example_ips(cb_to_cs& c, CB::label& ld, COST_SENSITIVE::label& cs_ld)
{
  // this implements the inverse propensity score method, where cost are importance weighted by the probability of the
  // chosen action generate cost-sensitive example
  cs_ld.costs.clear();
  if (ld.costs.size() == 0 || (ld.costs.size() == 1 && ld.costs[0].cost != FLT_MAX))
  // this is a typical example where we can perform all actions
  {
    // in this case generate cost-sensitive example with all actions
    for (uint32_t i = 1; i <= c.num_actions; i++)
    {
      COST_SENSITIVE::wclass wc = {0., i, 0., 0.};
      if (c.known_cost != nullptr && i == c.known_cost->action)
      {
        wc.x = c.known_cost->cost /
            safe_probability(
                c.known_cost->probability);  // use importance weighted cost for observed action, 0 otherwise
        // ips can be thought as the doubly robust method with a fixed regressor that predicts 0 costs for everything
        // update the loss of this regressor
        c.nb_ex_regressors++;
        c.avg_loss_regressors +=
            (1.0f / c.nb_ex_regressors) * ((c.known_cost->cost) * (c.known_cost->cost) - c.avg_loss_regressors);
        c.last_pred_reg = 0;
        c.last_correct_cost = c.known_cost->cost;
      }

      cs_ld.costs.push_back(wc);
    }
  }
  else  // this is an example where we can only perform a subset of the actions
  {
    // in this case generate cost-sensitive example with only allowed actions
    for (auto& cl : ld.costs)
    {
      COST_SENSITIVE::wclass wc = {0., cl.action, 0., 0.};
      if (c.known_cost != nullptr && cl.action == c.known_cost->action)
      {
        wc.x = c.known_cost->cost /
            safe_probability(
                c.known_cost->probability);  // use importance weighted cost for observed action, 0 otherwise

        // ips can be thought as the doubly robust method with a fixed regressor that predicts 0 costs for everything
        // update the loss of this regressor
        c.nb_ex_regressors++;
        c.avg_loss_regressors +=
            (1.0f / c.nb_ex_regressors) * ((c.known_cost->cost) * (c.known_cost->cost) - c.avg_loss_regressors);
        c.last_pred_reg = 0;
        c.last_correct_cost = c.known_cost->cost;
      }

      cs_ld.costs.push_back(wc);
    }
  }
}